

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O1

DOMNode * __thiscall xercesc_4_0::DOMNodeIteratorImpl::nextNode(DOMNodeIteratorImpl *this)

{
  bool bVar1;
  DOMNode *pDVar2;
  DOMException *this_00;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      pDVar2 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar2 = &this->fDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar2->_vptr_DOMNode);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (this->fRoot == (DOMNode *)0x0) {
LAB_0027b922:
    pDVar2 = (DOMNode *)0x0;
  }
  else {
    pDVar2 = this->fCurrentNode;
    bVar1 = false;
    do {
      if (bVar1 != false) goto LAB_0027b922;
      if (pDVar2 == (DOMNode *)0x0 || this->fForward != false) {
        pDVar2 = nextNode(this,pDVar2,true);
      }
      else {
        pDVar2 = this->fCurrentNode;
      }
      this->fForward = true;
      if (pDVar2 == (DOMNode *)0x0) goto LAB_0027b922;
      bVar1 = acceptNode(this,pDVar2);
    } while (!bVar1);
    this->fCurrentNode = pDVar2;
  }
  return pDVar2;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::nextNode () {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    // if root is 0 there is no next node->
    if (!fRoot)
			return 0;

    DOMNode* aNextNode = fCurrentNode;
    bool accepted = false; // the next node has not been accepted.

    while (!accepted) {

        // if last direction is not forward, repeat node->
        if (!fForward && (aNextNode != 0)) {
            //System.out.println("nextNode():!fForward:"+fCurrentNode.getNodeName());
            aNextNode = fCurrentNode;
        } else {
        // else get the next node via depth-first
            aNextNode = nextNode(aNextNode, true);
        }

        fForward = true; //REVIST: should direction be set forward before 0 check?

        // nothing in the list. return 0.
        if (!aNextNode) return 0;

        // does node pass the filters and whatToShow?
        accepted = acceptNode(aNextNode);
        if (accepted) {
            // if so, then the node is the current node->
            fCurrentNode = aNextNode;
            return fCurrentNode;
        }
    }

    // no nodes, or no accepted nodes.
    return 0;
}